

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::ICRS2Ecliptic(CESkyCoord *in_icrs,CESkyCoord *out_ecliptic,CEDate *date)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RDX;
  long *in_RSI;
  double *in_RDI;
  CEDate *this;
  double dVar3;
  CEAngle CVar4;
  double tt2;
  double tt1;
  double elat;
  double elon;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  CEDateType date_format;
  double in_stack_fffffffffffffeb8;
  CEDate *in_stack_fffffffffffffec0;
  double *angle;
  undefined4 local_114;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [64];
  CEAngle local_b0 [2];
  undefined1 local_90 [64];
  CEAngle local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20 [2];
  long *local_10;
  double *local_8;
  
  local_20[0] = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = (**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TT(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  uVar2 = local_30;
  uVar1 = local_38;
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  angle = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,date_format);
  (**(code **)((long)*angle + 0x18))(&local_50,angle,local_90);
  this = (CEDate *)CEAngle::Rad(&local_50);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(this,dVar3,(CEDateType)((ulong)local_8 >> 0x20));
  (**(code **)((long)*local_8 + 0x20))(local_b0,local_8,local_f0);
  dVar3 = CEAngle::Rad(local_b0);
  iauEqec06(uVar2,uVar1,this,dVar3,local_20,&local_28);
  CEAngle::~CEAngle((CEAngle *)0x164bf8);
  CEDate::~CEDate((CEDate *)0x164c02);
  CEAngle::~CEAngle((CEAngle *)0x164c0f);
  CEDate::~CEDate((CEDate *)0x164c1c);
  CEAngle::Rad(angle);
  CVar4 = CEAngle::Rad(angle);
  local_114 = 4;
  (**(code **)(*local_10 + 0x28))(CVar4.angle_,local_10,local_100,local_110,&local_114);
  CEAngle::~CEAngle((CEAngle *)0x164c80);
  CEAngle::~CEAngle((CEAngle *)0x164c8a);
  return;
}

Assistant:

void CESkyCoord::ICRS2Ecliptic(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_ecliptic,
                               const CEDate&     date)
{
    // Use the sofa method to convert the coordinates
    double elon(0.0);
    double elat(0.0);

    // Get the time in TT
    double tt1(0.0);
    double tt2(0.0);
    CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

    // Convert ICRS -> ECLIPTIC
    iauEqec06(tt1, tt2, in_icrs.XCoord().Rad(), in_icrs.YCoord().Rad(), 
              &elon, &elat);
    out_ecliptic->SetCoordinates(CEAngle::Rad(elon), 
                                 CEAngle::Rad(elat),
                                 CESkyCoordType::ECLIPTIC);

    return;
}